

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian_opt.cpp
# Opt level: O2

void compute_response_layer_Dyy_leftcorner(response_layer *layer,integral_image *iimage)

{
  int iVar1;
  int cols;
  int iVar2;
  int iVar3;
  float *pfVar4;
  bool *pbVar5;
  float *pfVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int rows;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  uint uVar19;
  long lVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int cols_00;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  int local_100;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  
  pfVar4 = layer->response;
  iVar23 = iimage->data_width;
  iVar1 = layer->step;
  cols = layer->filter_size;
  pbVar5 = layer->laplacian;
  iVar2 = layer->width;
  iVar3 = layer->height;
  cols_00 = cols / 3;
  iVar11 = (cols + -1) / 2;
  pfVar6 = iimage->data;
  fVar25 = 1.0 / (float)(cols * cols);
  uVar10 = cols / 6;
  iVar18 = iVar23 * iVar11 + cols_00;
  iVar12 = -cols_00;
  iVar13 = -uVar10;
  iVar14 = -iVar11;
  rows = cols_00 * 2 + -1;
  iVar15 = ((cols_00 + -1) - uVar10) * iVar23 + cols_00;
  for (iVar22 = 0; iVar22 <= (int)uVar10; iVar22 = iVar22 + iVar1) {
    iVar16 = iVar22 - cols_00;
    lVar17 = (long)((iVar22 / iVar1) * iVar2);
    iVar24 = 1;
    for (lVar20 = 0; lVar20 < cols_00; lVar20 = lVar20 + iVar1) {
      auVar9 = vfmadd213ss_fma(ZEXT416((uint)pfVar6[iVar15 + -2 + iVar24]),
                               SUB6416(ZEXT464(0xc0400000),0),
                               ZEXT416((uint)pfVar6[iVar18 + -2 + iVar24]));
      fVar26 = box_integral(iimage,iVar16 + 1,iVar14 + -1 + iVar24,rows,cols);
      auVar31._0_4_ = box_integral(iimage,iVar16 + 1,iVar13 + -1 + iVar24,rows,cols_00);
      auVar31._4_60_ = extraout_var;
      auVar8 = vfmadd132ss_fma(auVar31._0_16_,ZEXT416((uint)fVar26),ZEXT416(0xc0400000));
      fVar27 = box_integral(iimage,iVar16,iVar24,cols_00,cols_00);
      iVar21 = iVar12 + -1 + iVar24;
      fVar28 = box_integral(iimage,iVar22 + 1,iVar21,cols_00,cols_00);
      fVar29 = box_integral(iimage,iVar16,iVar21,cols_00,cols_00);
      fVar30 = box_integral(iimage,iVar22 + 1,iVar24,cols_00,cols_00);
      fVar26 = fVar25 * auVar9._0_4_;
      fVar7 = fVar25 * auVar8._0_4_;
      fVar27 = fVar25 * (((fVar28 + fVar27) - fVar29) - fVar30);
      auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar27 * fVar27 * -0.81)),ZEXT416((uint)fVar7),
                               ZEXT416((uint)fVar26));
      pfVar4[lVar17] = auVar8._0_4_;
      iVar24 = iVar1 + iVar24;
      pbVar5[lVar17] = 0.0 <= fVar26 + fVar7;
      lVar17 = lVar17 + 1;
    }
    iVar18 = iVar18 + iVar1 * iVar23;
    iVar15 = iVar15 + iVar1 * iVar23;
  }
  iVar15 = uVar10 + iVar1;
  uVar19 = iVar15 % iVar1;
  iVar16 = iVar15 - uVar19;
  iVar22 = iVar1 * iVar23;
  iVar18 = ((iVar15 + iVar11) - uVar19) * iVar23 + cols_00;
  local_100 = ((~uVar19 + iVar15 + cols_00) - uVar10) * iVar23 + cols_00;
  iVar23 = (~uVar10 + iVar16) * iVar23 + cols_00;
  for (; iVar16 <= iVar11; iVar16 = iVar16 + iVar1) {
    iVar15 = iVar16 - cols_00;
    lVar17 = (long)((iVar16 / iVar1) * iVar2);
    iVar24 = 1;
    for (lVar20 = 0; lVar20 < cols_00; lVar20 = lVar20 + iVar1) {
      auVar9 = vfmadd213ss_fma(ZEXT416((uint)(pfVar6[local_100 + -2 + iVar24] -
                                             pfVar6[iVar23 + -2 + iVar24])),
                               SUB6416(ZEXT464(0xc0400000),0),
                               ZEXT416((uint)pfVar6[iVar18 + -2 + iVar24]));
      fVar26 = box_integral(iimage,iVar15 + 1,iVar14 + -1 + iVar24,rows,cols);
      auVar32._0_4_ = box_integral(iimage,iVar15 + 1,iVar13 + -1 + iVar24,rows,cols_00);
      auVar32._4_60_ = extraout_var_00;
      auVar8 = vfmadd132ss_fma(auVar32._0_16_,ZEXT416((uint)fVar26),ZEXT416(0xc0400000));
      fVar27 = box_integral(iimage,iVar15,iVar24,cols_00,cols_00);
      iVar21 = iVar12 + -1 + iVar24;
      fVar28 = box_integral(iimage,iVar16 + 1,iVar21,cols_00,cols_00);
      fVar29 = box_integral(iimage,iVar15,iVar21,cols_00,cols_00);
      fVar30 = box_integral(iimage,iVar16 + 1,iVar24,cols_00,cols_00);
      fVar26 = fVar25 * auVar9._0_4_;
      fVar7 = fVar25 * auVar8._0_4_;
      fVar27 = fVar25 * (((fVar28 + fVar27) - fVar29) - fVar30);
      auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar27 * fVar27 * -0.81)),ZEXT416((uint)fVar7),
                               ZEXT416((uint)fVar26));
      pfVar4[lVar17] = auVar8._0_4_;
      iVar24 = iVar1 + iVar24;
      pbVar5[lVar17] = 0.0 <= fVar26 + fVar7;
      lVar17 = lVar17 + 1;
    }
    iVar18 = iVar18 + iVar22;
    local_100 = local_100 + iVar22;
    iVar23 = iVar23 + iVar22;
  }
  iVar23 = (cols_00 + -1 + iVar1) / iVar1;
  iVar18 = 0;
  while( true ) {
    if (iVar18 - iVar11 != 0 && iVar11 <= iVar18) break;
    iVar22 = iVar18 - cols_00;
    lVar17 = (long)((iVar18 / iVar1) * iVar2 + iVar23);
    for (iVar15 = iVar23 * iVar1; iVar15 < iVar2 * iVar1; iVar15 = iVar1 + iVar15) {
      fVar26 = box_integral(iimage,iVar22 + 1,iVar14 + iVar15,rows,cols);
      auVar33._0_4_ = box_integral(iimage,iVar22 + 1,iVar13 + iVar15,rows,cols_00);
      auVar33._4_60_ = extraout_var_01;
      auVar9 = vfmadd213ss_fma(auVar33._0_16_,SUB6416(ZEXT464(0xc0400000),0),ZEXT416((uint)fVar26));
      iVar16 = iVar12 + 1 + iVar15;
      fVar26 = box_integral(iimage,iVar18 - iVar11,iVar16,cols,rows);
      auVar34._0_4_ = box_integral(iimage,iVar18 - uVar10,iVar16,cols_00,rows);
      auVar34._4_60_ = extraout_var_02;
      auVar8 = vfmadd132ss_fma(auVar34._0_16_,ZEXT416((uint)fVar26),ZEXT416(0xc0400000));
      fVar27 = box_integral(iimage,iVar22,iVar15 + 1,cols_00,cols_00);
      fVar28 = box_integral(iimage,iVar18 + 1,iVar12 + iVar15,cols_00,cols_00);
      fVar29 = box_integral(iimage,iVar22,iVar12 + iVar15,cols_00,cols_00);
      fVar30 = box_integral(iimage,iVar18 + 1,iVar15 + 1,cols_00,cols_00);
      fVar26 = fVar25 * auVar8._0_4_;
      fVar7 = fVar25 * auVar9._0_4_;
      fVar27 = fVar25 * (((fVar28 + fVar27) - fVar29) - fVar30);
      auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar27 * fVar27 * -0.81)),ZEXT416((uint)fVar7),
                               ZEXT416((uint)fVar26));
      pfVar4[lVar17] = auVar8._0_4_;
      pbVar5[lVar17] = 0.0 <= fVar7 + fVar26;
      lVar17 = lVar17 + 1;
    }
    iVar18 = iVar18 + iVar1;
  }
  for (iVar23 = (iVar11 + iVar1) - (iVar11 + iVar1) % iVar1; iVar23 < iVar3 * iVar1;
      iVar23 = iVar23 + iVar1) {
    iVar16 = iVar23 - cols_00;
    lVar17 = (long)((iVar23 / iVar1) * iVar2);
    iVar15 = iVar12;
    iVar22 = iVar14;
    iVar18 = iVar13;
    for (iVar24 = 1; iVar24 + -1 < iVar2 * iVar1; iVar24 = iVar24 + iVar1) {
      fVar26 = box_integral(iimage,iVar16 + 1,iVar22,rows,cols);
      auVar35._0_4_ = box_integral(iimage,iVar16 + 1,iVar18,rows,cols_00);
      auVar35._4_60_ = extraout_var_03;
      auVar9 = vfmadd213ss_fma(auVar35._0_16_,SUB6416(ZEXT464(0xc0400000),0),ZEXT416((uint)fVar26));
      fVar26 = box_integral(iimage,iVar23 - iVar11,iVar15 + 1,cols,rows);
      auVar36._0_4_ = box_integral(iimage,iVar23 - uVar10,iVar15 + 1,cols_00,rows);
      auVar36._4_60_ = extraout_var_04;
      auVar8 = vfmadd132ss_fma(auVar36._0_16_,ZEXT416((uint)fVar26),ZEXT416(0xc0400000));
      fVar27 = box_integral(iimage,iVar16,iVar24,cols_00,cols_00);
      fVar28 = box_integral(iimage,iVar23 + 1,iVar15,cols_00,cols_00);
      fVar29 = box_integral(iimage,iVar16,iVar15,cols_00,cols_00);
      fVar30 = box_integral(iimage,iVar23 + 1,iVar24,cols_00,cols_00);
      fVar26 = fVar25 * auVar8._0_4_;
      fVar7 = fVar25 * auVar9._0_4_;
      fVar27 = fVar25 * (((fVar28 + fVar27) - fVar29) - fVar30);
      auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar27 * fVar27 * -0.81)),ZEXT416((uint)fVar7),
                               ZEXT416((uint)fVar26));
      pfVar4[lVar17] = auVar8._0_4_;
      pbVar5[lVar17] = 0.0 <= fVar7 + fVar26;
      lVar17 = lVar17 + 1;
      iVar18 = iVar18 + iVar1;
      iVar22 = iVar22 + iVar1;
      iVar15 = iVar15 + iVar1;
    }
  }
  return;
}

Assistant:

void compute_response_layer_Dyy_leftcorner(struct response_layer *layer, struct integral_image *iimage) {
    /*
        base function: compute_response_layer

        optimization:
        - Dyy box filter hand optimized and split into cases (here only leftcorner)
    */
    float Dxx, Dyy, Dxy;
    int x, y;
    int r0, r1, c0, c1, r00, r01, c00, c01, r10, r11, c10, c11;
    float Dyy0, Dyy1;
    float A, B, C, D;
    int k;

    float *response = layer->response;
    bool *laplacian = layer->laplacian;

    int data_width = iimage->data_width;
    int step = layer->step;
    int filter_size = layer->filter_size;
    int height = layer->height;
    int width = layer->width;

    int lobe = filter_size / 3;
    int border = (filter_size - 1) / 2;
    float inv_area = 1.f / (filter_size * filter_size);

    int ind = 0;  // oder alternativ (i+1)*j

    float *data = (float *) iimage->data;  // brauch hier keinen cast weil es eig float sein sollte
    int iheight = iimage->height;
    int iwidth = iimage->width;

    /*
        In our optimized function, i and j are raw coordinates in the integral
        / original image. In the original function these coordinates are
        coordinates of the layer. We changed it this way in the optimized function
        because its easier to about corner cases in raw coordinates.
    */

    // Top Left Corner - Case 1: B of neg part outside
    for (int i = 0; i < lobe / 2 + 1; i += step) {  // Inner B is outside, i.e. 0
        ind = (i / step) * width;

        for (int j = 0; j < lobe; j += step) {  // c0 = col - 1 = (y - lobe + 1) -1 < 0
            // Image coordinates
            x = i;
            y = j;

            // Compute Dyy  
            // whole box filter
            r01 = x + border;
            c01 = y + lobe - 1;

            Dyy0 = data[r01 * data_width + c01];  // seg fault at: i: 12, j:0

            // neg part box filter
            r10 = x - lobe / 2 - 1;
            r11 = r10 + lobe;  // -1 is already part of r10
            c11 = y + lobe - 1;

            D = data[r11 * data_width + c11];
            Dyy1 = D;

            Dyy = Dyy0 - 3 * Dyy1;

            // Compute Dxx, Dxy
            Dxx = box_integral(iimage, x - lobe + 1, y - border, 2 * lobe - 1, filter_size) -
                  3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2 * lobe - 1, lobe);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }

    // Top Left Corner - Case 2: B of neg part inside
    // initial value has to be rounded up to next bigger step
    k = (lobe / 2 + 1 + step - 1) / step * step;

    for (int i = k; i < border + 1; i += step) {  // Inner B is inside
        ind = (i / step) * width;

        for (int j = 0; j < lobe; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Compute Dyy
            // whole box filter
            r01 = x + border;
            c01 = y + lobe - 1;

            Dyy0 = data[r01 * data_width + c01];

            // neg part box filter
            r10 = x - lobe / 2 - 1;
            r11 = r10 + lobe;   // -1 is already part of r10
            c11 = y + lobe - 1;

            B = data[r10 * data_width + c11];
            D = data[r11 * data_width + c11];
            Dyy1 = D - B;

            Dyy = Dyy0 - 3 * Dyy1;

            // Compute Dxx, Dxy
            Dxx = box_integral(iimage, x - lobe + 1, y - border, 2 * lobe - 1, filter_size) -
                  3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2 * lobe - 1, lobe);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }

    // Rest
    k = (lobe + step - 1) / step * step;

    for (int i = 0; i < border + 1; i += step) {
        ind = (i / step) * width + (k / step);

        for (int j = k; j < width * step; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dxx = box_integral(iimage, x - lobe + 1, y - border, 2 * lobe - 1, filter_size) -
                  3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2 * lobe - 1, lobe);
            Dyy = box_integral(iimage, x - border, y - lobe + 1, filter_size, 2 * lobe - 1) -
                  3 * box_integral(iimage, x - lobe / 2, y - lobe + 1, lobe, 2 * lobe - 1);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // printf("OPTIMIZED: (%i, %i) - Dyy: %f, Dxx: %f, Dxy: %f\n\n", i, j, Dyy, Dxx, Dxy);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }

    k = (border + 1 + step - 1) / step * step;

    for (int i = k; i < height * step; i += step) {
        ind = (i / step) * width;

        for (int j = 0; j < width * step; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dxx = box_integral(iimage, x - lobe + 1, y - border, 2 * lobe - 1, filter_size) -
                  3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2 * lobe - 1, lobe);
            Dyy = box_integral(iimage, x - border, y - lobe + 1, filter_size, 2 * lobe - 1) -
                  3 * box_integral(iimage, x - lobe / 2, y - lobe + 1, lobe, 2 * lobe - 1);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }
}